

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

int add_tpl_ref_mv(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,MV_REFERENCE_FRAME ref_frame
                  ,int blk_row,int blk_col,int_mv *gm_mv_candidates,uint8_t *refmv_count,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,int16_t *mode_context)

{
  _Bool _Var1;
  MV ref;
  TPL_MV_REF *pTVar2;
  ushort uVar3;
  MV_REFERENCE_FRAME ref_frame_00;
  int iVar4;
  RefCntBuffer *pRVar5;
  ushort uVar6;
  uint uVar7;
  MV_REFERENCE_FRAME ref_frame_01;
  ulong uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  undefined7 in_register_00000081;
  int iVar12;
  OrderHintInfo *oh;
  int_mv this_refmv;
  uint local_50;
  int_mv comp_refmv;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  POSITION mi_pos;
  
  local_50 = (uint)CONCAT71(in_register_00000081,ref_frame);
  iVar12 = (~mi_row & 1U) + blk_row;
  iVar9 = (~mi_col & 1U) + blk_col;
  local_44 = blk_row;
  mi_pos.row = iVar12;
  mi_pos.col = iVar9;
  iVar4 = is_inside(&xd->tile,mi_col,mi_row,&mi_pos);
  if (iVar4 == 0) {
    return 0;
  }
  iVar4 = ((cm->mi_params).mi_stride >> 1) * (iVar12 + mi_row >> 1);
  pTVar2 = cm->tpl_mvs;
  lVar10 = (long)(iVar9 + mi_col >> 1);
  ref = pTVar2[iVar4 + lVar10].mfmv0.as_mv;
  if (ref == (MV)0x80008000) {
    return 0;
  }
  local_48 = blk_col;
  ref_frame_01 = -1;
  ref_frame_00 = (MV_REFERENCE_FRAME)local_50;
  if ('\a' < ref_frame_00) {
    uVar7 = (local_50 & 0xff) - 8;
    ref_frame_00 = ref_frame_map[uVar7][0];
    ref_frame_01 = ref_frame_map[uVar7][1];
  }
  uVar7 = cm->cur_frame->order_hint;
  pRVar5 = get_ref_frame_buf(cm,ref_frame_00);
  oh = &cm->seq_params->order_hint_info;
  local_3c = uVar7;
  iVar9 = get_relative_dist(oh,uVar7,pRVar5->order_hint);
  _Var1 = (cm->features).cur_frame_force_integer_mv;
  uVar7 = (uint)(cm->features).allow_high_precision_mv;
  local_40 = (uint)pTVar2[iVar4 + lVar10].ref_frame_offset;
  get_mv_projection(&this_refmv.as_mv,ref,iVar9,local_40);
  lower_mv_precision(&this_refmv.as_mv,uVar7,(uint)_Var1);
  if (ref_frame_01 != -1) {
    pRVar5 = get_ref_frame_buf(cm,ref_frame_01);
    iVar4 = get_relative_dist(oh,local_3c,pRVar5->order_hint);
    get_mv_projection(&comp_refmv.as_mv,ref,iVar4,local_40);
    lower_mv_precision(&comp_refmv.as_mv,uVar7,(uint)_Var1);
    if (local_48 == 0 && local_44 == 0) {
      iVar4 = (int)this_refmv.as_mv.row - (int)(gm_mv_candidates->as_mv).row;
      uVar3 = (ushort)iVar4;
      uVar6 = -uVar3;
      if (0 < iVar4) {
        uVar6 = uVar3;
      }
      if (uVar6 < 0x10) {
        iVar4 = (int)this_refmv.as_mv.col - (int)(gm_mv_candidates->as_mv).col;
        uVar3 = (ushort)iVar4;
        uVar6 = -uVar3;
        if (0 < iVar4) {
          uVar6 = uVar3;
        }
        if (uVar6 < 0x10) {
          iVar4 = (int)comp_refmv.as_mv.row - (int)gm_mv_candidates[1].as_mv.row;
          uVar3 = (ushort)iVar4;
          uVar6 = -uVar3;
          if (0 < iVar4) {
            uVar6 = uVar3;
          }
          if (uVar6 < 0x10) {
            iVar4 = (int)comp_refmv.as_mv.col - (int)*(short *)((long)gm_mv_candidates + 6);
            uVar3 = (ushort)iVar4;
            uVar6 = -uVar3;
            if (0 < iVar4) {
              uVar6 = uVar3;
            }
            if (uVar6 < 0x10) goto LAB_003308a0;
          }
        }
      }
      *(byte *)(mode_context + (char)local_50) = *(byte *)(mode_context + (char)local_50) | 8;
    }
LAB_003308a0:
    bVar11 = *refmv_count;
    uVar8 = 0;
    do {
      if (bVar11 == uVar8) {
        uVar8 = (ulong)bVar11;
LAB_00330968:
        if (7 < bVar11 || (uint)uVar8 != (uint)bVar11) {
          return 1;
        }
        uVar8 = uVar8 & 0xffffffff;
        ref_mv_stack[uVar8].this_mv = this_refmv;
        ref_mv_stack[uVar8].comp_mv = comp_refmv;
        ref_mv_weight[uVar8] = 2;
        *refmv_count = *refmv_count + '\x01';
        return 1;
      }
      if ((this_refmv.as_int == ref_mv_stack[uVar8].this_mv.as_int) &&
         (comp_refmv.as_int == ref_mv_stack[uVar8].comp_mv.as_int)) {
        ref_mv_weight[uVar8] = ref_mv_weight[uVar8] + 2;
        bVar11 = *refmv_count;
        goto LAB_00330968;
      }
      uVar8 = uVar8 + 1;
    } while( true );
  }
  if (local_48 == 0 && local_44 == 0) {
    iVar4 = (int)this_refmv.as_mv.row - (int)(gm_mv_candidates->as_mv).row;
    uVar3 = (ushort)iVar4;
    uVar6 = -uVar3;
    if (0 < iVar4) {
      uVar6 = uVar3;
    }
    if (uVar6 < 0x10) {
      iVar9 = (int)this_refmv.as_mv.col - (int)(gm_mv_candidates->as_mv).col;
      iVar4 = -iVar9;
      if (0 < iVar9) {
        iVar4 = iVar9;
      }
      if ((ushort)iVar4 < 0x10) goto LAB_00330931;
    }
    *(byte *)(mode_context + (char)local_50) = *(byte *)(mode_context + (char)local_50) | 8;
  }
LAB_00330931:
  bVar11 = *refmv_count;
  uVar8 = 0;
  do {
    if (bVar11 == uVar8) {
      uVar8 = (ulong)bVar11;
LAB_003309b3:
      if (bVar11 < 8 && (uint)uVar8 == (uint)bVar11) {
        ref_mv_stack[uVar8 & 0xffffffff].this_mv = this_refmv;
        ref_mv_weight[uVar8 & 0xffffffff] = 2;
        *refmv_count = *refmv_count + '\x01';
      }
      return 1;
    }
    if (this_refmv.as_int == ref_mv_stack[uVar8].this_mv.as_int) {
      ref_mv_weight[uVar8] = ref_mv_weight[uVar8] + 2;
      bVar11 = *refmv_count;
      goto LAB_003309b3;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static int add_tpl_ref_mv(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                          int mi_row, int mi_col, MV_REFERENCE_FRAME ref_frame,
                          int blk_row, int blk_col, int_mv *gm_mv_candidates,
                          uint8_t *const refmv_count,
                          CANDIDATE_MV ref_mv_stack[MAX_REF_MV_STACK_SIZE],
                          uint16_t ref_mv_weight[MAX_REF_MV_STACK_SIZE],
                          int16_t *mode_context) {
  POSITION mi_pos;
  mi_pos.row = (mi_row & 0x01) ? blk_row : blk_row + 1;
  mi_pos.col = (mi_col & 0x01) ? blk_col : blk_col + 1;

  if (!is_inside(&xd->tile, mi_col, mi_row, &mi_pos)) return 0;

  const TPL_MV_REF *prev_frame_mvs =
      cm->tpl_mvs +
      ((mi_row + mi_pos.row) >> 1) * (cm->mi_params.mi_stride >> 1) +
      ((mi_col + mi_pos.col) >> 1);
  if (prev_frame_mvs->mfmv0.as_int == INVALID_MV) return 0;

  MV_REFERENCE_FRAME rf[2];
  av1_set_ref_frame(rf, ref_frame);

  const uint16_t weight_unit = 1;  // mi_size_wide[BLOCK_8X8];
  const int cur_frame_index = cm->cur_frame->order_hint;
  const RefCntBuffer *const buf_0 = get_ref_frame_buf(cm, rf[0]);
  const int frame0_index = buf_0->order_hint;
  const int cur_offset_0 = get_relative_dist(&cm->seq_params->order_hint_info,
                                             cur_frame_index, frame0_index);
  int idx;
  const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
  const int force_integer_mv = cm->features.cur_frame_force_integer_mv;

  int_mv this_refmv;
  get_mv_projection(&this_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                    cur_offset_0, prev_frame_mvs->ref_frame_offset);
  lower_mv_precision(&this_refmv.as_mv, allow_high_precision_mv,
                     force_integer_mv);

  if (rf[1] == NONE_FRAME) {
    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx)
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int) break;

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  } else {
    // Process compound inter mode
    const RefCntBuffer *const buf_1 = get_ref_frame_buf(cm, rf[1]);
    const int frame1_index = buf_1->order_hint;
    const int cur_offset_1 = get_relative_dist(&cm->seq_params->order_hint_info,
                                               cur_frame_index, frame1_index);
    int_mv comp_refmv;
    get_mv_projection(&comp_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                      cur_offset_1, prev_frame_mvs->ref_frame_offset);
    lower_mv_precision(&comp_refmv.as_mv, allow_high_precision_mv,
                       force_integer_mv);

    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16 ||
          abs(comp_refmv.as_mv.row - gm_mv_candidates[1].as_mv.row) >= 16 ||
          abs(comp_refmv.as_mv.col - gm_mv_candidates[1].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx) {
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int &&
          comp_refmv.as_int == ref_mv_stack[idx].comp_mv.as_int)
        break;
    }

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_stack[idx].comp_mv.as_int = comp_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  }

  return 1;
}